

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O2

ImVec2 ImFont_CalcTextSizeA
                 (ImFont *self,float size,float max_width,float wrap_width,char *text_begin,
                 char *text_end,char **remaining)

{
  ImVec2 IVar1;
  
  IVar1 = ImFont::CalcTextSizeA(self,size,max_width,wrap_width,text_begin,text_end,remaining);
  return IVar1;
}

Assistant:

CIMGUI_API ImVec2 *_ImFont_CalcTextSizeA (ImFont *larg1, float larg2, float larg3, float larg4, char *larg5, char *larg6, char **larg7) {
  ImVec2 * lresult = (ImVec2 *)0 ;
  ImFont *arg1 = (ImFont *) 0 ;
  float arg2 ;
  float arg3 ;
  float arg4 ;
  char *arg5 = (char *) 0 ;
  char *arg6 = (char *) 0 ;
  char **arg7 = (char **) 0 ;
  ImVec2 result;
  
  arg1 = larg1;
  arg2 = larg2;
  arg3 = larg3;
  arg4 = larg4;
  arg5 = larg5;
  arg6 = larg6;
  arg7 = larg7;
  try {
    result = ImFont_CalcTextSizeA(arg1,arg2,arg3,arg4,(char const *)arg5,(char const *)arg6,(char const **)arg7);
    lresult = new ImVec2(result);
    return lresult;
  } catch (...) {
    return (ImVec2 *)0;
  }
}